

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

void __thiscall ncnn::Convolution_x86::Convolution_x86(Convolution_x86 *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_Convolution_x86 = pp_Var1;
  *(void **)((long)&this->_vptr_Convolution_x86 + (long)pp_Var1[-3]) = vtt[1];
  *(undefined8 *)((long)&(this->weight_3x3_winograd23_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_3x3_winograd23_data).elemsize + 4) = 0;
  (this->weight_3x3_winograd23_data).data = (void *)0x0;
  (this->weight_3x3_winograd23_data).refcount = (int *)0x0;
  (this->weight_3x3_winograd23_data_int8).data = (void *)0x0;
  (this->weight_3x3_winograd23_data_int8).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_3x3_winograd23_data_int8).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_3x3_winograd23_data_int8).elemsize + 4) = 0;
  (this->weight_3x3_winograd23_data_int8).allocator = (Allocator *)0x0;
  (this->weight_3x3_winograd23_data_int8).dims = 0;
  (this->weight_3x3_winograd23_data_int8).w = 0;
  (this->weight_3x3_winograd23_data_int8).h = 0;
  (this->weight_3x3_winograd23_data_int8).c = 0;
  (this->weight_3x3_winograd23_data_int8).cstep = 0;
  this->activation = (Layer *)0x0;
  (this->weight_3x3_winograd23_data).allocator = (Allocator *)0x0;
  (this->weight_3x3_winograd23_data).dims = 0;
  (this->weight_3x3_winograd23_data).w = 0;
  (this->weight_3x3_winograd23_data).h = 0;
  (this->weight_3x3_winograd23_data).c = 0;
  (this->weight_3x3_winograd23_data).cstep = 0;
  (this->weight_sgemm_data).data = (void *)0x0;
  (this->weight_sgemm_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_sgemm_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_sgemm_data).elemsize + 4) = 0;
  (this->weight_sgemm_data).allocator = (Allocator *)0x0;
  (this->weight_sgemm_data).dims = 0;
  (this->weight_sgemm_data).w = 0;
  (this->weight_sgemm_data).h = 0;
  (this->weight_sgemm_data).c = 0;
  (this->weight_sgemm_data).cstep = 0;
  (this->weight_3x3_winograd43_data).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weight_3x3_winograd43_data).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->weight_3x3_winograd43_data).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->convolution_dilation1 = (Layer *)0x0;
  return;
}

Assistant:

Convolution_x86::Convolution_x86()
{
    activation = 0;
    convolution_dilation1 = 0;
}